

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::reallocateTo
          (SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *this,size_type newCapacity)

{
  RsCaseItemSyntax **__result;
  iterator __first;
  EVP_PKEY_CTX *ctx;
  pointer newData;
  size_type newCapacity_local;
  SmallVectorBase<slang::syntax::RsCaseItemSyntax_*> *this_local;
  
  __result = (RsCaseItemSyntax **)slang::detail::allocArray(newCapacity,8);
  __first = begin(this);
  ctx = (EVP_PKEY_CTX *)end(this);
  std::uninitialized_move<slang::syntax::RsCaseItemSyntax**,slang::syntax::RsCaseItemSyntax**>
            (__first,(RsCaseItemSyntax **)ctx,__result);
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = __result;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)detail::allocArray(newCapacity, sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }